

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<unsigned_long,long_double>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,unsigned_long *t_lhs,
          unsigned_long *c_lhs,longdouble *c_rhs)

{
  ulong uVar1;
  undefined8 *puVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  bool b;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  Boxed_Value BVar7;
  
  switch(t_oper) {
  case equals:
    b = (longdouble)(long)*c_lhs +
        (longdouble)*(float *)(&DAT_0040b0c8 + (ulong)((long)*c_lhs < 0) * 4) == *c_rhs;
    break;
  case less_than:
    lVar5 = (longdouble)(long)*c_lhs +
            (longdouble)*(float *)(&DAT_0040b0c8 + (ulong)((long)*c_lhs < 0) * 4);
    lVar4 = *c_rhs;
    goto LAB_003b2b4d;
  case greater_than:
    lVar4 = (longdouble)(long)*c_lhs +
            (longdouble)*(float *)(&DAT_0040b0c8 + (ulong)((long)*c_lhs < 0) * 4);
    lVar5 = *c_rhs;
LAB_003b2b4d:
    b = lVar5 < lVar4;
    break;
  case less_than_equal:
    lVar5 = (longdouble)(long)*c_lhs +
            (longdouble)*(float *)(&DAT_0040b0c8 + (ulong)((long)*c_lhs < 0) * 4);
    lVar4 = *c_rhs;
    goto LAB_003b2aec;
  case greater_than_equal:
    lVar4 = (longdouble)(long)*c_lhs +
            (longdouble)*(float *)(&DAT_0040b0c8 + (ulong)((long)*c_lhs < 0) * 4);
    lVar5 = *c_rhs;
LAB_003b2aec:
    b = lVar5 <= lVar4;
    break;
  case not_equal:
    b = (longdouble)(long)*c_lhs +
        (longdouble)*(float *)(&DAT_0040b0c8 + (ulong)((long)*c_lhs < 0) * 4) != *c_rhs;
    break;
  default:
    switch(t_oper) {
    case sum:
      break;
    case quotient:
      break;
    case product:
      break;
    case difference:
      break;
    default:
      if (t_lhs == (unsigned_long *)0x0) {
switchD_003b2a1d_caseD_7:
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = &PTR__bad_cast_004a2090;
        __cxa_throw(puVar2,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      switch(t_oper) {
      case assign:
        lVar5 = *c_rhs;
        lVar6 = (longdouble)9.223372e+18;
        lVar4 = (longdouble)0;
        if (lVar6 <= lVar5) {
          lVar4 = lVar6;
        }
        uVar1 = (ulong)(lVar6 <= lVar5) << 0x3f ^ (long)ROUND(lVar5 - lVar4);
        break;
      default:
        goto switchD_003b2a1d_caseD_7;
      case assign_product:
        lVar6 = ((longdouble)(long)*t_lhs +
                (longdouble)*(float *)(&DAT_0040b0c8 + (ulong)((long)*t_lhs < 0) * 4)) * *c_rhs;
        lVar4 = (longdouble)9.223372e+18;
        lVar5 = (longdouble)0;
        if (lVar4 <= lVar6) {
          lVar5 = lVar4;
        }
        uVar1 = (ulong)(lVar4 <= lVar6) << 0x3f ^ (long)ROUND(lVar6 - lVar5);
        break;
      case assign_sum:
        lVar6 = (longdouble)(long)*t_lhs +
                (longdouble)*(float *)(&DAT_0040b0c8 + (ulong)((long)*t_lhs < 0) * 4) + *c_rhs;
        lVar4 = (longdouble)9.223372e+18;
        lVar5 = (longdouble)0;
        if (lVar4 <= lVar6) {
          lVar5 = lVar4;
        }
        uVar1 = (ulong)(lVar4 <= lVar6) << 0x3f ^ (long)ROUND(lVar6 - lVar5);
        break;
      case assign_quotient:
        lVar6 = ((longdouble)(long)*t_lhs +
                (longdouble)*(float *)(&DAT_0040b0c8 + (ulong)((long)*t_lhs < 0) * 4)) / *c_rhs;
        lVar4 = (longdouble)9.223372e+18;
        lVar5 = (longdouble)0;
        if (lVar4 <= lVar6) {
          lVar5 = lVar4;
        }
        uVar1 = (ulong)(lVar4 <= lVar6) << 0x3f ^ (long)ROUND(lVar6 - lVar5);
        break;
      case assign_difference:
        lVar6 = ((longdouble)(long)*t_lhs +
                (longdouble)*(float *)(&DAT_0040b0c8 + (ulong)((long)*t_lhs < 0) * 4)) - *c_rhs;
        lVar4 = (longdouble)9.223372e+18;
        lVar5 = (longdouble)0;
        if (lVar4 <= lVar6) {
          lVar5 = lVar4;
        }
        uVar1 = (ulong)(lVar4 <= lVar6) << 0x3f ^ (long)ROUND(lVar6 - lVar5);
      }
      *t_lhs = uVar1;
      std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)t_bv);
      _Var3._M_pi = extraout_RDX;
      goto LAB_003b2bd3;
    }
    BVar7 = detail::const_var_impl<long_double>((longdouble *)this);
    _Var3._M_pi = BVar7.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    goto LAB_003b2bd3;
  }
  BVar7 = const_var((chaiscript *)this,b);
  _Var3._M_pi = BVar7.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
LAB_003b2bd3:
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }